

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O1

int OpenSSL_client_verify_callback(int preverify_ok,X509_STORE_CTX *x509_ctx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  SSL *pSVar6;
  void *pvVar7;
  char *pcVar8;
  int unaff_R14D;
  
  if (preverify_ok != 0) goto LAB_0012965d;
  uVar2 = X509_STORE_CTX_get_error((X509_STORE_CTX *)x509_ctx);
  bVar1 = true;
  if (uVar2 != 0) {
    iVar3 = SSL_get_ex_data_X509_STORE_CTX_idx();
    pSVar6 = (SSL *)X509_STORE_CTX_get_ex_data((X509_STORE_CTX *)x509_ctx,iVar3);
    pvVar7 = SSL_get_ex_data(pSVar6,openssl_websocket_private_data_index);
    if (pvVar7 == (void *)0x0) {
      bVar1 = false;
      _lws_log(1,"%s: can\'t get wsi from ssl privdata\n","OpenSSL_client_verify_callback");
      unaff_R14D = 0;
    }
    else {
      if ((uVar2 & 0xfffffffe) == 0x14) {
        if ((*(byte *)((long)pvVar7 + 0x2b8) & 0x10) == 0) goto LAB_001295be;
        pcVar8 = "accepting non-trusted certificate\n";
LAB_0012961d:
        _lws_log(4,pcVar8);
      }
      else {
        if (((uVar2 & 0xfffffffe) == 0x12) && ((*(byte *)((long)pvVar7 + 0x2b8) & 2) != 0)) {
          pcVar8 = "accepting self-signed certificate (verify_callback)\n";
          goto LAB_0012961d;
        }
LAB_001295be:
        if ((1 < uVar2 - 9) || ((*(byte *)((long)pvVar7 + 0x2b8) & 8) == 0)) goto LAB_00129654;
        if (uVar2 == 9) {
          pcVar8 = "accepting not yet valid certificate (verify_callback)\n";
LAB_00129635:
          _lws_log(4,pcVar8);
        }
        else if (uVar2 == 10) {
          pcVar8 = "accepting expired certificate (verify_callback)\n";
          goto LAB_00129635;
        }
      }
      bVar1 = false;
      X509_STORE_CTX_set_error((X509_STORE_CTX *)x509_ctx,0);
      unaff_R14D = 1;
    }
  }
LAB_00129654:
  if (!bVar1) {
    return unaff_R14D;
  }
LAB_0012965d:
  iVar3 = SSL_get_ex_data_X509_STORE_CTX_idx();
  pSVar6 = (SSL *)X509_STORE_CTX_get_ex_data((X509_STORE_CTX *)x509_ctx,iVar3);
  pvVar7 = SSL_get_ex_data(pSVar6,openssl_websocket_private_data_index);
  if (pvVar7 == (void *)0x0) {
    uVar2 = 0;
    _lws_log(1,"%s: can\'t get wsi from ssl privdata\n","OpenSSL_client_verify_callback");
  }
  else {
    iVar3 = (**(code **)(*(long *)(*(long *)(*(long *)((long)pvVar7 + 0x1f8) + 0x420) + 0x1a0) + 8))
                      (pvVar7,0x3a,x509_ctx,pSVar6,(long)preverify_ok);
    if ((preverify_ok == 0) &&
       (uVar4 = X509_STORE_CTX_get_error((X509_STORE_CTX *)x509_ctx), uVar4 != 0)) {
      uVar5 = X509_STORE_CTX_get_error_depth((X509_STORE_CTX *)x509_ctx);
      pcVar8 = X509_verify_cert_error_string((long)(int)uVar4);
      uVar2 = 0;
      _lws_log(1,"SSL error: %s (preverify_ok=%d;err=%d;depth=%d)\n",pcVar8,0,(ulong)uVar4,
               (ulong)uVar5);
    }
    else {
      uVar2 = (uint)(iVar3 == 0);
    }
  }
  return uVar2;
}

Assistant:

static int
OpenSSL_client_verify_callback(int preverify_ok, X509_STORE_CTX *x509_ctx)
{
	SSL *ssl;
	int n;
	struct lws *wsi;

	/* keep old behaviour accepting self-signed server certs */
	if (!preverify_ok) {
		int err = X509_STORE_CTX_get_error(x509_ctx);

		if (err != X509_V_OK) {
			ssl = X509_STORE_CTX_get_ex_data(x509_ctx,
					SSL_get_ex_data_X509_STORE_CTX_idx());
			wsi = SSL_get_ex_data(ssl,
					openssl_websocket_private_data_index);
			if (!wsi) {
				lwsl_err("%s: can't get wsi from ssl privdata\n",
					 __func__);

				return 0;
			}

			if ((err == X509_V_ERR_DEPTH_ZERO_SELF_SIGNED_CERT ||
			     err == X509_V_ERR_SELF_SIGNED_CERT_IN_CHAIN) &&
			     wsi->tls.use_ssl & LCCSCF_ALLOW_SELFSIGNED) {
				lwsl_notice("accepting self-signed "
					    "certificate (verify_callback)\n");
				X509_STORE_CTX_set_error(x509_ctx, X509_V_OK);
				return 1;	// ok
		} else if ((err == X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT_LOCALLY ||
			    err == X509_V_ERR_UNABLE_TO_VERIFY_LEAF_SIGNATURE) &&
			    wsi->tls.use_ssl & LCCSCF_ALLOW_INSECURE) {
				lwsl_notice("accepting non-trusted certificate\n");
				X509_STORE_CTX_set_error(x509_ctx, X509_V_OK);
				return 1;  /* ok */
			} else if ((err == X509_V_ERR_CERT_NOT_YET_VALID ||
				    err == X509_V_ERR_CERT_HAS_EXPIRED) &&
				    wsi->tls.use_ssl & LCCSCF_ALLOW_EXPIRED) {
				if (err == X509_V_ERR_CERT_NOT_YET_VALID)
					lwsl_notice("accepting not yet valid "
						    "certificate (verify_"
						    "callback)\n");
				else if (err == X509_V_ERR_CERT_HAS_EXPIRED)
					lwsl_notice("accepting expired "
						    "certificate (verify_"
						    "callback)\n");
				X509_STORE_CTX_set_error(x509_ctx, X509_V_OK);
				return 1;	// ok
			}
		}
	}

	ssl = X509_STORE_CTX_get_ex_data(x509_ctx,
					 SSL_get_ex_data_X509_STORE_CTX_idx());
	wsi = SSL_get_ex_data(ssl, openssl_websocket_private_data_index);
	if (!wsi) {
		lwsl_err("%s: can't get wsi from ssl privdata\n",  __func__);

		return 0;
	}

	n = lws_get_context_protocol(wsi->context, 0).callback(wsi,
			LWS_CALLBACK_OPENSSL_PERFORM_SERVER_CERT_VERIFICATION,
			x509_ctx, ssl, preverify_ok);

	/* keep old behaviour if something wrong with server certs */
	/* if ssl error is overruled in callback and cert is ok,
	 * X509_STORE_CTX_set_error(x509_ctx, X509_V_OK); must be set and
	 * return value is 0 from callback */
	if (!preverify_ok) {
		int err = X509_STORE_CTX_get_error(x509_ctx);

		if (err != X509_V_OK) {
			/* cert validation error was not handled in callback */
			int depth = X509_STORE_CTX_get_error_depth(x509_ctx);
			const char *msg = X509_verify_cert_error_string(err);

			lwsl_err("SSL error: %s (preverify_ok=%d;err=%d;"
				 "depth=%d)\n", msg, preverify_ok, err, depth);

			return preverify_ok;	// not ok
		}
	}
	/*
	 * convert callback return code from 0 = OK to verify callback
	 * return value 1 = OK
	 */
	return !n;
}